

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList_item * isSelfJoinView(SrcList *pTabList,SrcList_item *pThis)

{
  int iVar1;
  SrcList_item *local_28;
  SrcList_item *pItem;
  SrcList_item *pThis_local;
  SrcList *pTabList_local;
  
  local_28 = pTabList->a;
  while( true ) {
    if (pThis <= local_28) {
      return (SrcList_item *)0x0;
    }
    if ((((local_28->pSelect != (Select *)0x0) && (((byte)(local_28->fg).field_0x1 >> 4 & 1) == 0))
        && (local_28->zName != (char *)0x0)) &&
       (((iVar1 = sqlite3_stricmp(local_28->zDatabase,pThis->zDatabase), iVar1 == 0 &&
         (iVar1 = sqlite3_stricmp(local_28->zName,pThis->zName), iVar1 == 0)) &&
        (iVar1 = sqlite3ExprCompare((Parse *)0x0,pThis->pSelect->pWhere,local_28->pSelect->pWhere,-1
                                   ), iVar1 == 0)))) break;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

static struct SrcList_item *isSelfJoinView(
  SrcList *pTabList,           /* Search for self-joins in this FROM clause */
  struct SrcList_item *pThis   /* Search for prior reference to this subquery */
){
  struct SrcList_item *pItem;
  for(pItem = pTabList->a; pItem<pThis; pItem++){
    if( pItem->pSelect==0 ) continue;
    if( pItem->fg.viaCoroutine ) continue;
    if( pItem->zName==0 ) continue;
    if( sqlite3_stricmp(pItem->zDatabase, pThis->zDatabase)!=0 ) continue;
    if( sqlite3_stricmp(pItem->zName, pThis->zName)!=0 ) continue;
    if( sqlite3ExprCompare(0, 
          pThis->pSelect->pWhere, pItem->pSelect->pWhere, -1) 
    ){
      /* The view was modified by some other optimization such as
      ** pushDownWhereTerms() */
      continue;
    }
    return pItem;
  }
  return 0;
}